

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O3

void __thiscall gvr::PointCloud::addExtend(PointCloud *this,Vector3d *emin,Vector3d *emax)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar23;
  double dVar21;
  undefined4 uVar24;
  undefined1 auVar22 [16];
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  double dVar28;
  float fVar29;
  double dVar30;
  float fVar31;
  float fVar35;
  double dVar32;
  undefined4 uVar36;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar37;
  float fVar38;
  float fVar40;
  double dVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  
  iVar5 = this->n;
  uVar10 = iVar5 * 3 - 3;
  if ((int)uVar10 < 0) {
    dVar28 = 3.4028234663852886e+38;
    dVar8 = -3.4028234663852886e+38;
    dVar39 = -3.4028234663852886e+38;
    dVar32 = -3.4028234663852886e+38;
    dVar30 = 3.4028234663852886e+38;
    dVar21 = 3.4028234663852886e+38;
  }
  else {
    pfVar6 = this->vertex;
    fVar29 = -3.4028235e+38;
    fVar45 = -3.4028235e+38;
    fVar41 = 3.4028235e+38;
    fVar42 = fVar45;
    fVar43 = 3.4028235e+38;
    fVar27 = 3.4028235e+38;
    do {
      fVar44 = 3.4028235e+38;
      fVar26 = -3.4028235e+38;
      fVar19 = -3.4028235e+38;
      fVar23 = -3.4028235e+38;
      uVar24 = 0;
      uVar25 = 0;
      fVar31 = 3.4028235e+38;
      fVar35 = 3.4028235e+38;
      uVar36 = 0;
      uVar37 = 0;
      lVar14 = (ulong)uVar10 + 3;
      do {
        uVar4 = *(ulong *)(pfVar6 + lVar14 + -3);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = uVar4;
        if ((((fVar29 <= (float)uVar4) && ((float)uVar4 < fVar41)) &&
            (fVar20 = (float)(uVar4 >> 0x20), fVar42 <= fVar20)) &&
           (((fVar20 < fVar43 && (fVar20 = pfVar6[lVar14 + -1], fVar45 <= fVar20)) &&
            (fVar20 < fVar27)))) {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = uVar4;
          auVar34._4_4_ = fVar35;
          auVar34._0_4_ = fVar31;
          auVar34._8_4_ = uVar36;
          auVar34._12_4_ = uVar37;
          auVar34 = minps(auVar33,auVar34);
          fVar31 = fVar20;
          if (fVar44 <= fVar20) {
            fVar31 = fVar44;
          }
          fVar44 = fVar31;
          auVar9._4_4_ = fVar23;
          auVar9._0_4_ = fVar19;
          auVar9._8_4_ = uVar24;
          auVar9._12_4_ = uVar25;
          auVar22 = maxps(auVar22,auVar9);
          if (fVar20 <= fVar26) {
            fVar20 = fVar26;
          }
          fVar26 = fVar20;
          fVar19 = auVar22._0_4_;
          fVar23 = auVar22._4_4_;
          uVar24 = auVar22._8_4_;
          uVar25 = auVar22._12_4_;
          fVar31 = auVar34._0_4_;
          fVar35 = auVar34._4_4_;
          uVar36 = auVar34._8_4_;
          uVar37 = auVar34._12_4_;
        }
        lVar14 = lVar14 + -3;
      } while (2 < lVar14);
      if (((fVar19 < fVar31) || (fVar23 < fVar35)) || (fVar26 < fVar44)) break;
      fVar38 = (fVar19 + fVar31) * 0.5;
      fVar40 = (fVar23 + fVar35) * 0.5;
      fVar20 = (fVar26 + fVar44) * 0.5;
      if ((int)uVar10 < 0) {
        iVar17 = 0;
        iVar12 = 0;
        iVar11 = 0;
        iVar13 = 0;
      }
      else {
        iVar13 = 0;
        iVar11 = 0;
        iVar12 = 0;
        iVar17 = 0;
        lVar14 = (ulong)uVar10 + 3;
        uVar15 = iVar5 * 3 - 1;
        do {
          fVar1 = pfVar6[lVar14 + -3];
          if (((((fVar29 <= fVar1) && (fVar1 < fVar41)) &&
               (fVar2 = pfVar6[uVar15 - 1], fVar42 <= fVar2)) &&
              ((fVar2 < fVar43 && (fVar3 = pfVar6[uVar15], fVar45 <= fVar3)))) && (fVar3 < fVar27))
          {
            auVar7._4_4_ = -(uint)(fVar1 < fVar38);
            auVar7._0_4_ = -(uint)(fVar1 < fVar38);
            auVar7._8_4_ = -(uint)(fVar2 < fVar40);
            auVar7._12_4_ = -(uint)(fVar2 < fVar40);
            uVar16 = movmskpd(uVar15,auVar7);
            iVar17 = iVar17 + (uVar16 & 1);
            iVar12 = iVar12 + (uVar16 >> 1 & 0x7f);
            iVar11 = iVar11 + (uint)(fVar3 < fVar20);
            iVar13 = iVar13 + 1;
          }
          uVar15 = uVar15 - 3;
          lVar14 = lVar14 + -3;
        } while (2 < lVar14);
      }
      fVar27 = fVar26;
      fVar41 = fVar19;
      fVar42 = fVar35;
      fVar43 = fVar23;
      fVar45 = fVar44;
      fVar29 = fVar31;
      if (iVar13 * 2 <= iVar5) break;
      if (fVar19 <= fVar31) {
        bVar18 = false;
      }
      else {
        bVar18 = iVar17 * 100 < iVar13;
        fVar29 = fVar38;
        if (iVar13 <= iVar17 * 100) {
          fVar29 = fVar31;
        }
        if ((iVar13 - iVar17) * 100 < iVar13) {
          bVar18 = true;
          fVar19 = fVar38;
        }
      }
      if (fVar35 < fVar23) {
        fVar41 = fVar40;
        if (iVar13 <= iVar12 * 100) {
          fVar41 = fVar35;
        }
        fVar35 = fVar41;
        if ((iVar13 - iVar12) * 100 < iVar13) {
          bVar18 = true;
          fVar23 = fVar40;
        }
        else {
          bVar18 = (bool)(iVar12 * 100 < iVar13 | bVar18);
        }
      }
      fVar41 = fVar19;
      fVar42 = fVar35;
      fVar43 = fVar23;
      if (fVar26 <= fVar44) {
LAB_00117e36:
        fVar20 = fVar26;
        fVar45 = fVar44;
        if (!bVar18) break;
      }
      else {
        fVar45 = fVar20;
        if (iVar13 <= iVar11 * 100) {
          fVar45 = fVar44;
        }
        if (iVar13 <= (iVar13 - iVar11) * 100) {
          bVar18 = (bool)(iVar11 * 100 < iVar13 | bVar18);
          fVar44 = fVar45;
          goto LAB_00117e36;
        }
      }
      fVar27 = fVar20;
    } while (-1 < (int)uVar10);
    dVar8 = (double)fVar29;
    dVar39 = (double)fVar42;
    dVar32 = (double)fVar45;
    dVar28 = (double)fVar41;
    dVar30 = (double)fVar43;
    dVar21 = (double)fVar27;
  }
  dVar8 = dVar8 + (this->super_Model).origin.v[0];
  if (emin->v[0] <= dVar8) {
    dVar8 = emin->v[0];
  }
  emin->v[0] = dVar8;
  dVar39 = dVar39 + (this->super_Model).origin.v[1];
  if (emin->v[1] <= dVar39) {
    dVar39 = emin->v[1];
  }
  emin->v[1] = dVar39;
  dVar32 = dVar32 + (this->super_Model).origin.v[2];
  if (emin->v[2] <= dVar32) {
    dVar32 = emin->v[2];
  }
  emin->v[2] = dVar32;
  dVar28 = dVar28 + (this->super_Model).origin.v[0];
  if (dVar28 <= emax->v[0]) {
    dVar28 = emax->v[0];
  }
  emax->v[0] = dVar28;
  dVar30 = dVar30 + (this->super_Model).origin.v[1];
  if (dVar30 <= emax->v[1]) {
    dVar30 = emax->v[1];
  }
  emax->v[1] = dVar30;
  dVar21 = dVar21 + (this->super_Model).origin.v[2];
  if (dVar21 <= emax->v[2]) {
    dVar21 = emax->v[2];
  }
  emax->v[2] = dVar21;
  return;
}

Assistant:

void PointCloud::addExtend(gmath::Vector3d &emin, gmath::Vector3d &emax) const
{
  float pxmin=-std::numeric_limits<float>::max();
  float pymin=-std::numeric_limits<float>::max();
  float pzmin=-std::numeric_limits<float>::max();
  float pxmax=std::numeric_limits<float>::max();
  float pymax=std::numeric_limits<float>::max();
  float pzmax=std::numeric_limits<float>::max();

  bool repeat=true;
  while (repeat)
  {
    repeat=false;

    // compute extend

    float xmin=std::numeric_limits<float>::max();
    float ymin=std::numeric_limits<float>::max();
    float zmin=std::numeric_limits<float>::max();
    float xmax=-std::numeric_limits<float>::max();
    float ymax=-std::numeric_limits<float>::max();
    float zmax=-std::numeric_limits<float>::max();

    for (int i=3*(n-1); i>=0; i-=3)
    {
      float x=vertex[i];
      float y=vertex[i+1];
      float z=vertex[i+2];

      if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
      {
        xmin=std::min(xmin, x);
        ymin=std::min(ymin, y);
        zmin=std::min(zmin, z);

        xmax=std::max(xmax, x);
        ymax=std::max(ymax, y);
        zmax=std::max(zmax, z);
      }
    }

    if (xmax >= xmin && ymax >= ymin && zmax >= zmin)
    {
      // divide range of each coordinate into two halves compute number of points
      // in each halve

      int nxmin=0;
      int nymin=0;
      int nzmin=0;
      int m=0;

      float xmean=(xmax+xmin)/2;
      float ymean=(ymax+ymin)/2;
      float zmean=(zmax+zmin)/2;

      for (int i=3*(n-1); i>=0; i-=3)
      {
        float x=vertex[i];
        float y=vertex[i+1];
        float z=vertex[i+2];

        if (x >= pxmin && x < pxmax && y >= pymin && y < pymax && z >= pzmin && z < pzmax)
        {
          if (vertex[i] < xmean)
          {
            nxmin++;
          }

          if (vertex[i+1] < ymean)
          {
            nymin++;
          }

          if (vertex[i+2] < zmean)
          {
            nzmin++;
          }

          m++;
        }
      }

      pxmin=xmin;
      pxmax=xmax;
      pymin=ymin;
      pymax=ymax;
      pzmin=zmin;
      pzmax=zmax;

      if (2*m > n)
      {
        // reduce range and try again if one half contains less than 1/100 of the
        // points

        if (pxmax > pxmin)
        {
          if (nxmin*100 < m)
          {
            pxmin=xmean;
            repeat=true;
          }

          if ((m-nxmin)*100 < m)
          {
            pxmax=xmean;
            repeat=true;
          }
        }

        if (pymax > pymin)
        {
          if (nymin*100 < m)
          {
            pymin=ymean;
            repeat=true;
          }

          if ((m-nymin)*100 < m)
          {
            pymax=ymean;
            repeat=true;
          }
        }

        if (pzmax > pzmin)
        {
          if (nzmin*100 < m)
          {
            pzmin=zmean;
            repeat=true;
          }

          if ((m-nzmin)*100 < m)
          {
            pzmax=zmean;
            repeat=true;
          }
        }
      }
    }
  }

  // add extend

  emin[0]=std::min(emin[0], getOrigin()[0]+pxmin);
  emin[1]=std::min(emin[1], getOrigin()[1]+pymin);
  emin[2]=std::min(emin[2], getOrigin()[2]+pzmin);

  emax[0]=std::max(emax[0], getOrigin()[0]+pxmax);
  emax[1]=std::max(emax[1], getOrigin()[1]+pymax);
  emax[2]=std::max(emax[2], getOrigin()[2]+pzmax);
}